

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fs-poll.c
# Opt level: O1

int statbuf_eq(uv_stat_t *a,uv_stat_t *b)

{
  bool local_19;
  uv_stat_t *b_local;
  uv_stat_t *a_local;
  
  local_19 = false;
  if ((((((a->st_ctim).tv_nsec == (b->st_ctim).tv_nsec) &&
        (local_19 = false, (a->st_mtim).tv_nsec == (b->st_mtim).tv_nsec)) &&
       (local_19 = false, (a->st_birthtim).tv_nsec == (b->st_birthtim).tv_nsec)) &&
      (((local_19 = false, (a->st_ctim).tv_sec == (b->st_ctim).tv_sec &&
        (local_19 = false, (a->st_mtim).tv_sec == (b->st_mtim).tv_sec)) &&
       ((local_19 = false, (a->st_birthtim).tv_sec == (b->st_birthtim).tv_sec &&
        ((local_19 = false, a->st_size == b->st_size && (local_19 = false, a->st_mode == b->st_mode)
         ))))))) &&
     ((local_19 = false, a->st_uid == b->st_uid &&
      ((((local_19 = false, a->st_gid == b->st_gid && (local_19 = false, a->st_ino == b->st_ino)) &&
        (local_19 = false, a->st_dev == b->st_dev)) &&
       (local_19 = false, a->st_flags == b->st_flags)))))) {
    local_19 = a->st_gen == b->st_gen;
  }
  return (int)local_19;
}

Assistant:

static int statbuf_eq(const uv_stat_t* a, const uv_stat_t* b) {
  return a->st_ctim.tv_nsec == b->st_ctim.tv_nsec
      && a->st_mtim.tv_nsec == b->st_mtim.tv_nsec
      && a->st_birthtim.tv_nsec == b->st_birthtim.tv_nsec
      && a->st_ctim.tv_sec == b->st_ctim.tv_sec
      && a->st_mtim.tv_sec == b->st_mtim.tv_sec
      && a->st_birthtim.tv_sec == b->st_birthtim.tv_sec
      && a->st_size == b->st_size
      && a->st_mode == b->st_mode
      && a->st_uid == b->st_uid
      && a->st_gid == b->st_gid
      && a->st_ino == b->st_ino
      && a->st_dev == b->st_dev
      && a->st_flags == b->st_flags
      && a->st_gen == b->st_gen;
}